

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shell.cpp
# Opt level: O0

bool anon_unknown.dwarf_5f2f::prefixed(string_view command,string_view prefix,string_view *suffix)

{
  bool bVar1;
  string_view *in_RCX;
  string_view *in_RDX;
  undefined8 *in_R8;
  string_view sVar2;
  char *local_50;
  size_t local_48;
  
  sVar2._len = (size_t)in_R8;
  sVar2._ptr = (char *)in_RCX;
  bVar1 = mserialize::string_view::starts_with(in_RDX,sVar2);
  if (bVar1) {
    mserialize::string_view::size((string_view *)&stack0xffffffffffffffd8);
    sVar2 = mserialize::string_view::substr(in_RCX,(size_type)in_RDX,(size_type)in_R8);
    local_50 = sVar2._ptr;
    *in_R8 = local_50;
    local_48 = sVar2._len;
    in_R8[1] = local_48;
  }
  return bVar1;
}

Assistant:

bool prefixed(mserialize::string_view command, mserialize::string_view prefix, mserialize::string_view& suffix)
{
  if (! command.starts_with(prefix)) { return false; }

  suffix = command.substr(prefix.size());
  return true;
}